

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

void * tp_worker(void *args)

{
  int *piVar1;
  cleanup_t p_Var2;
  qnode_t *pqVar3;
  _Bool _Var4;
  uint32_t uVar5;
  int iVar6;
  int __not_first_call_2;
  void *__cancel_arg_2;
  _func_void_void_ptr *__cancel_routine_2;
  __pthread_unwind_buf_t __cancel_buf_2;
  int __not_first_call_1;
  void *__cancel_arg_1;
  _func_void_void_ptr *__cancel_routine_1;
  __pthread_unwind_buf_t __cancel_buf_1;
  int __not_first_call;
  void *__cancel_arg;
  _func_void_void_ptr *__cancel_routine;
  __pthread_unwind_buf_t __cancel_buf;
  thread_pool_t *local_28;
  tp_task_t *task;
  thread_pool_t *pool;
  qdata_t data;
  void *args_local;
  
  data.ptr = args;
  __cancel_buf_1.__pad[3]._4_4_ = __sigsetjmp(&__cancel_routine,0);
  if (__cancel_buf_1.__pad[3]._4_4_ != 0) {
    tp_cleanup(args);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_routine);
  }
  __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_routine);
  do {
    do {
      pool = (thread_pool_t *)0x0;
      local_28 = (thread_pool_t *)0x0;
      pthread_mutex_lock((pthread_mutex_t *)((long)args + 0x28));
      __cancel_buf_2.__pad[3]._4_4_ = __sigsetjmp(&__cancel_routine_1,0);
      if (__cancel_buf_2.__pad[3]._4_4_ != 0) {
        tp_cleanup_unlock(args);
        __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_routine_1);
      }
      __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_routine_1);
      while (uVar5 = queue_len((queue_t *)((long)args + 0x10)), uVar5 == 0) {
        pthread_cond_wait((pthread_cond_t *)((long)args + 0x50),
                          (pthread_mutex_t *)((long)args + 0x28));
      }
      _Var4 = queue_dequeue((queue_t *)((long)args + 0x10),(qdata_t *)&pool);
      if (_Var4) {
        local_28 = pool;
      }
      __pthread_unregister_cancel((__pthread_unwind_buf_t *)&__cancel_routine_1);
      pthread_mutex_unlock((pthread_mutex_t *)((long)args + 0x28));
    } while ((local_28 == (thread_pool_t *)0x0) || (*(long *)local_28 == 0));
    if ((cleanup_t)local_28->threads == (cleanup_t)0x0) {
      (**(code **)local_28)((local_28->task_queue).head);
    }
    else {
      p_Var2 = (cleanup_t)local_28->threads;
      pqVar3 = (local_28->task_queue).head;
      iVar6 = __sigsetjmp(&__cancel_routine_2,0);
      if (iVar6 != 0) {
        (*p_Var2)(pqVar3);
        __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_routine_2);
      }
      __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_routine_2);
      (**(code **)local_28)((local_28->task_queue).head);
      __pthread_unregister_cancel((__pthread_unwind_buf_t *)&__cancel_routine_2);
      (*(code *)local_28->threads)((local_28->task_queue).head);
    }
    LOCK();
    piVar1 = (int *)((long)args + 0x80);
    iVar6 = *piVar1;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (iVar6 == 1) {
      pthread_cond_signal((pthread_cond_t *)((long)args + 0x88));
    }
    tp_task_free((tp_task_t *)local_28);
  } while( true );
}

Assistant:

void *tp_worker(void *args)
{
    qdata_t data;
    thread_pool_t *pool = args;
    tp_task_t *task = NULL;

    pthread_cleanup_push(tp_cleanup, pool) ;

            while (1) {
                data.ptr = NULL;
                task = NULL;

                // Take a task
                pthread_mutex_lock(&pool->lock);

                pthread_cleanup_push(tp_cleanup_unlock, pool) ;
                        // If no task in queue, wait until someone post one.
                        while (queue_isempty(&pool->task_queue)) {
                            pthread_cond_wait(&pool->has_task, &pool->lock);
                        }
                        // Dequeue a task for running
                        if (queue_dequeue(&pool->task_queue, &data)) {
                            task = data.ptr;
                        }

                pthread_cleanup_pop(0);

                pthread_mutex_unlock(&pool->lock);

                // Run a task
                if (task && task->runner) {
                    if (task->cleanup) {
                        pthread_cleanup_push(task->cleanup, task->args) ;
                                task->runner(task->args);
                        pthread_cleanup_pop(0);
                        task->cleanup(task->args);
                    } else {
                        task->runner(task->args);
                    }


                    // Note: pool->task_queue is empty DO NOT means there is no task
                    //
                    // If there is no task remain in the queue after dequeue operation,
                    // signal for tp_join_task()
                    if (__sync_sub_and_fetch(&pool->active_tasks, 1) == 0) {
                        pthread_cond_signal(&pool->no_task);
                    }

                    tp_task_free(task);
                    task = NULL;
                }
            }

    pthread_cleanup_pop(0);

    return NULL;
}